

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_rasterization_line_state
          (Impl *this,Value *state,VkPipelineRasterizationLineStateCreateInfoKHR **out_info)

{
  VkLineRasterizationMode VVar1;
  uint uVar2;
  VkPipelineRasterizationLineStateCreateInfo *pVVar3;
  Type pGVar4;
  VkPipelineRasterizationLineStateCreateInfo *info;
  VkPipelineRasterizationLineStateCreateInfoKHR **out_info_local;
  Value *state_local;
  Impl *this_local;
  
  pVVar3 = ScratchAllocator::allocate_cleared<VkPipelineRasterizationLineStateCreateInfo>
                     (&this->allocator);
  pGVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"lineRasterizationMode");
  VVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar4);
  pVVar3->lineRasterizationMode = VVar1;
  pGVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"stippledLineEnable");
  uVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar4);
  pVVar3->stippledLineEnable = uVar2;
  pGVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"lineStippleFactor");
  uVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar4);
  pVVar3->lineStippleFactor = uVar2;
  pGVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"lineStipplePattern");
  uVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar4);
  pVVar3->lineStipplePattern = (uint16_t)uVar2;
  *out_info = pVVar3;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_rasterization_line_state(const Value &state,
                                                         VkPipelineRasterizationLineStateCreateInfoKHR **out_info)
{
	auto *info = allocator.allocate_cleared<VkPipelineRasterizationLineStateCreateInfoKHR>();

	info->lineRasterizationMode = static_cast<VkLineRasterizationModeEXT>(state["lineRasterizationMode"].GetUint());
	info->stippledLineEnable = state["stippledLineEnable"].GetUint();
	info->lineStippleFactor = state["lineStippleFactor"].GetUint();
	info->lineStipplePattern = state["lineStipplePattern"].GetUint();

	*out_info = info;
	return true;
}